

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O3

void __thiscall
VmaAllocator_T::GetBufferMemoryRequirements
          (VmaAllocator_T *this,VkBuffer hBuffer,VkMemoryRequirements *memReq,
          bool *requiresDedicatedAllocation,bool *prefersDedicatedAllocation)

{
  bool bVar1;
  bool bVar2;
  VkMemoryDedicatedRequirementsKHR memDedicatedReq;
  VkMemoryRequirements2KHR memReq2;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  VkBufferMemoryRequirementsInfo2 local_78;
  VkMemoryRequirements2 local_58;
  
  local_58.pNext = &local_98;
  if ((this->m_UseKhrDedicatedAllocation == false) && (this->m_VulkanApiVersion < 0x401000)) {
    (*(this->m_VulkanFunctions).vkGetBufferMemoryRequirements)(this->m_hDevice,hBuffer,memReq);
    bVar1 = false;
    bVar2 = false;
  }
  else {
    local_78.sType = VK_STRUCTURE_TYPE_BUFFER_MEMORY_REQUIREMENTS_INFO_2;
    local_78._4_4_ = 0;
    local_78.pNext = (void *)0x0;
    local_88 = 0;
    local_98 = 0x3b9cba18;
    local_58.memoryRequirements.memoryTypeBits = 0;
    local_58.memoryRequirements._20_4_ = 0;
    local_58.memoryRequirements.size = 0;
    local_58.memoryRequirements.alignment = 0;
    local_58.sType = VK_STRUCTURE_TYPE_MEMORY_REQUIREMENTS_2;
    local_58._4_4_ = 0;
    uStack_90 = 0;
    local_78.buffer = hBuffer;
    (*(this->m_VulkanFunctions).vkGetBufferMemoryRequirements2KHR)
              (this->m_hDevice,&local_78,&local_58);
    memReq->memoryTypeBits = local_58.memoryRequirements.memoryTypeBits;
    *(undefined4 *)&memReq->field_0x14 = local_58.memoryRequirements._20_4_;
    memReq->size = local_58.memoryRequirements.size;
    memReq->alignment = local_58.memoryRequirements.alignment;
    bVar1 = local_88._4_4_ != 0;
    bVar2 = (int)local_88 != 0;
  }
  *requiresDedicatedAllocation = bVar1;
  *prefersDedicatedAllocation = bVar2;
  return;
}

Assistant:

void VmaAllocator_T::GetBufferMemoryRequirements(
    VkBuffer hBuffer,
    VkMemoryRequirements& memReq,
    bool& requiresDedicatedAllocation,
    bool& prefersDedicatedAllocation) const
{
#if VMA_DEDICATED_ALLOCATION || VMA_VULKAN_VERSION >= 1001000
    if(m_UseKhrDedicatedAllocation || m_VulkanApiVersion >= VK_MAKE_VERSION(1, 1, 0))
    {
        VkBufferMemoryRequirementsInfo2KHR memReqInfo = { VK_STRUCTURE_TYPE_BUFFER_MEMORY_REQUIREMENTS_INFO_2_KHR };
        memReqInfo.buffer = hBuffer;

        VkMemoryDedicatedRequirementsKHR memDedicatedReq = { VK_STRUCTURE_TYPE_MEMORY_DEDICATED_REQUIREMENTS_KHR };

        VkMemoryRequirements2KHR memReq2 = { VK_STRUCTURE_TYPE_MEMORY_REQUIREMENTS_2_KHR };
        VmaPnextChainPushFront(&memReq2, &memDedicatedReq);

        (*m_VulkanFunctions.vkGetBufferMemoryRequirements2KHR)(m_hDevice, &memReqInfo, &memReq2);

        memReq = memReq2.memoryRequirements;
        requiresDedicatedAllocation = (memDedicatedReq.requiresDedicatedAllocation != VK_FALSE);
        prefersDedicatedAllocation  = (memDedicatedReq.prefersDedicatedAllocation  != VK_FALSE);
    }
    else
#endif // #if VMA_DEDICATED_ALLOCATION || VMA_VULKAN_VERSION >= 1001000
    {
        (*m_VulkanFunctions.vkGetBufferMemoryRequirements)(m_hDevice, hBuffer, &memReq);
        requiresDedicatedAllocation = false;
        prefersDedicatedAllocation  = false;
    }
}